

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infinite_suite.cpp
# Opt level: O2

void double_1_1_suite::test_input_half_output_quarter(void)

{
  double *pdVar1;
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  value_type local_e0 [1];
  vector<double,_std::allocator<double>_> history;
  infinite<double> filter;
  
  history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  history.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0[0] = 0.25;
  trial::online::impulse::infinite<double>::infinite<1ul,1ul>
            (&filter,(value_type (*) [1])&stack0xffffffffffffff18,&local_e0,1.0);
  trial::online::impulse::infinite<double>::push(&filter,1.0);
  trial::online::impulse::infinite<double>::value(&filter);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&history,(double *)&stack0xffffffffffffff18);
  pdVar1 = (double *)trial::online::impulse::infinite<double>::value(&filter);
  local_e0[0] = 0.5;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1 * 0.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/impulse/infinite_suite.cpp"
             ,(char *)0x6b,0x106311,&stack0xffffffffffffff18,(double *)local_e0,pdVar1,predicate);
  trial::online::impulse::infinite<double>::push(&filter,2.0);
  trial::online::impulse::infinite<double>::value(&filter);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&history,(double *)&stack0xffffffffffffff18);
  pdVar1 = (double *)trial::online::impulse::infinite<double>::value(&filter);
  local_e0[0] = *history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start * -0.25 + 1.0;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","2 * 0.5 - history[0] * 0.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/impulse/infinite_suite.cpp"
             ,(char *)0x6e,0x106311,&stack0xffffffffffffff18,(double *)local_e0,pdVar1,predicate_00)
  ;
  trial::online::impulse::infinite<double>::push(&filter,3.0);
  trial::online::impulse::infinite<double>::value(&filter);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&history,(double *)&stack0xffffffffffffff18);
  pdVar1 = (double *)trial::online::impulse::infinite<double>::value(&filter);
  local_e0[0] = history.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[1] * -0.25 + 1.5;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","3 * 0.5 - history[1] * 0.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/impulse/infinite_suite.cpp"
             ,(char *)0x71,0x106311,&stack0xffffffffffffff18,(double *)local_e0,pdVar1,predicate_01)
  ;
  trial::online::impulse::infinite<double>::~infinite(&filter);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&history.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void test_input_half_output_quarter()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    std::vector<double> history;
    impulse::infinite<double> filter({0.5}, {0.25});
    filter.push(1);
    history.push_back(filter.value());
    TRIAL_TEST_WITH(filter.value(), 1 * 0.5, tolerance);
    filter.push(2);
    history.push_back(filter.value());
    TRIAL_TEST_WITH(filter.value(), 2 * 0.5 - history[0] * 0.25, tolerance);
    filter.push(3);
    history.push_back(filter.value());
    TRIAL_TEST_WITH(filter.value(), 3 * 0.5 - history[1] * 0.25, tolerance);
}